

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reporter.cc
# Opt level: O1

bool __thiscall benchmark::CSVReporter::ReportContext(CSVReporter *this,Context *context)

{
  ostream *poVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  
  BenchmarkReporter::PrintBasicContext((this->super_BenchmarkReporter).error_stream_,context);
  poVar1 = (this->super_BenchmarkReporter).output_stream_;
  puVar2 = (anonymous_namespace)::elements_abi_cxx11_;
  if ((anonymous_namespace)::elements_abi_cxx11_ != DAT_00143a50) {
    do {
      puVar3 = puVar2 + 4;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)*puVar2,puVar2[1]);
      if (puVar3 != DAT_00143a50) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
      }
      puVar2 = puVar3;
    } while (puVar3 != DAT_00143a50);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return true;
}

Assistant:

bool CSVReporter::ReportContext(const Context& context) {
  PrintBasicContext(&GetErrorStream(), context);

  std::ostream& Out = GetOutputStream();
  for (auto B = elements.begin(); B != elements.end(); ) {
    Out << *B++;
    if (B != elements.end())
      Out << ",";
  }
  Out << "\n";
  return true;
}